

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpBitwise
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  TokenKind TokenKind_00;
  bool bVar1;
  pointer pEVar2;
  IntAST *pIVar3;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_78;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_70;
  unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_> local_68;
  unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_> local_60;
  unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_> local_58;
  unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_> local_50 [3];
  unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_> local_38;
  uint local_30;
  uint local_2c;
  int R;
  int L;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS_local;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS_local;
  BinaryOperatorAST *pBStack_10;
  TokenKind TokenKind_local;
  
  _R = RHS;
  RHS_local = LHS;
  LHS_local._4_4_ = TokenKind;
  pBStack_10 = this;
  pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (LHS);
  bVar1 = ExpressionAST::isInt(pEVar2);
  if (bVar1) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(RHS);
    bVar1 = ExpressionAST::isInt(pEVar2);
    if (bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(LHS);
      pIVar3 = ExpressionAST::as_cptr<cmm::IntAST>(pEVar2);
      local_2c = IntAST::getValue(pIVar3);
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      pIVar3 = ExpressionAST::as_cptr<cmm::IntAST>(pEVar2);
      local_30 = IntAST::getValue(pIVar3);
      switch(LHS_local._4_4_) {
      case Amp:
        pIVar3 = (IntAST *)operator_new(0x10);
        IntAST::IntAST(pIVar3,local_2c & local_30);
        std::unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>>::
        unique_ptr<std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>> *)&local_58,pIVar3);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_58);
        std::unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_>::~unique_ptr(&local_58);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case Pipe:
        pIVar3 = (IntAST *)operator_new(0x10);
        IntAST::IntAST(pIVar3,local_2c | local_30);
        std::unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>>::
        unique_ptr<std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>> *)&local_60,pIVar3);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_60);
        std::unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_>::~unique_ptr(&local_60);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case LessLess:
        pIVar3 = (IntAST *)operator_new(0x10);
        IntAST::IntAST(pIVar3,local_2c << ((byte)local_30 & 0x1f));
        std::unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>>::
        unique_ptr<std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>> *)&local_38,pIVar3);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_38);
        std::unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_>::~unique_ptr(&local_38);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case GreaterGreater:
        pIVar3 = (IntAST *)operator_new(0x10);
        IntAST::IntAST(pIVar3,(int)local_2c >> ((byte)local_30 & 0x1f));
        std::unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>>::
        unique_ptr<std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>> *)local_50,pIVar3);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   local_50);
        std::unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_>::~unique_ptr(local_50);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      case Caret:
        pIVar3 = (IntAST *)operator_new(0x10);
        IntAST::IntAST(pIVar3,local_2c ^ local_30);
        std::unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>>::
        unique_ptr<std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>> *)&local_68,pIVar3);
        std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
        unique_ptr<cmm::IntAST,std::default_delete<cmm::IntAST>,void>
                  ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,
                   &local_68);
        std::unique_ptr<cmm::IntAST,_std::default_delete<cmm::IntAST>_>::~unique_ptr(&local_68);
        return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )this;
      }
    }
  }
  TokenKind_00 = LHS_local._4_4_;
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
            (&local_70,LHS);
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::unique_ptr
            (&local_78,RHS);
  create(this,TokenKind_00,&local_70,&local_78);
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
            (&local_78);
  std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::~unique_ptr
            (&local_70);
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpBitwise(Token::TokenKind TokenKind,
                                       std::unique_ptr<ExpressionAST> LHS,
                                       std::unique_ptr<ExpressionAST> RHS) {
  if (LHS->isInt() && RHS->isInt()) {
    int L = LHS->as_cptr<IntAST>()->getValue();
    int R = RHS->as_cptr<IntAST>()->getValue();

    switch (TokenKind) {
    default:break;
    case Token::LessLess:
      return std::unique_ptr<IntAST>(new IntAST(L << R));
    case Token::GreaterGreater:
      return std::unique_ptr<IntAST>(new IntAST(L >> R));
    case Token::Amp:
      return std::unique_ptr<IntAST>(new IntAST(L & R));
    case Token::Pipe:
      return std::unique_ptr<IntAST>(new IntAST(L | R));
    case Token::Caret:
      return std::unique_ptr<IntAST>(new IntAST(L ^ R));
    }
  }
  return BinaryOperatorAST::create(TokenKind, std::move(LHS), std::move(RHS));
}